

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

Id __thiscall
anon_unknown.dwarf_d6fcf8::TGlslangToSpvTraverser::createBinaryOperation
          (TGlslangToSpvTraverser *this,TOperator op,OpDecorations *decorations,Id typeId,Id left,
          Id right,TBasicType typeProxy,bool reduceComparison)

{
  uint uVar1;
  Builder *pBVar2;
  pointer ppIVar3;
  Instruction *pIVar4;
  bool bVar5;
  bool bVar6;
  Op OVar7;
  Op opCode;
  Id IVar8;
  uint uVar9;
  Id IVar10;
  Id right_00;
  Instruction *pIVar11;
  ulong uVar12;
  uint __tmp;
  Id IVar13;
  byte bVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> results;
  Id local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  Op local_74;
  uint local_70;
  Id local_6c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  uVar9 = typeProxy - EbtUint8;
  uVar1 = typeProxy - EbtFloat;
  bVar6 = true;
  IVar8 = 0;
  opCode = OpVectorTimesMatrix;
  local_84 = right;
  local_80 = left;
  switch(op) {
  case EOpAdd:
switchD_003c06b9_caseD_19:
    opCode = (uVar1 < 3) + OpIAdd;
    break;
  case EOpSub:
switchD_003c06b9_caseD_1a:
    opCode = (uVar1 < 3) + OpISub;
    break;
  case EOpMul:
switchD_003c06b9_caseD_1b:
    opCode = (uVar1 < 3) + OpIMul;
    break;
  case EOpDiv:
switchD_003c06b9_caseD_1c:
    OVar7 = OpSDiv - ((uVar9 & 0xfffffff9) == 0);
    opCode = OpFDiv;
    goto LAB_003c07dc;
  case EOpMod:
switchD_003c06b9_caseD_1d:
    bVar5 = (uVar9 & 0xfffffff9) != 0;
    OVar7 = bVar5 + 0x89 + (uint)bVar5;
    opCode = OpFMod;
LAB_003c07dc:
    if (2 < uVar1) {
      opCode = OVar7;
    }
    break;
  case EOpRightShift:
switchD_003c06b9_caseD_1e:
    opCode = OpShiftRightArithmetic - ((uVar9 & 0xfffffff9) == 0);
    break;
  case EOpLeftShift:
switchD_003c06b9_caseD_1f:
    opCode = OpShiftLeftLogical;
    break;
  case EOpAnd:
switchD_003c06b9_caseD_20:
    opCode = OpBitwiseAnd;
    break;
  case EOpInclusiveOr:
switchD_003c06b9_caseD_21:
    opCode = OpBitwiseOr;
    break;
  case EOpExclusiveOr:
switchD_003c06b9_caseD_22:
    opCode = OpBitwiseXor;
    break;
  case EOpEqual:
  case EOpNotEqual:
  case EOpVectorEqual:
  case EOpVectorNotEqual:
  case EOpLessThan:
  case EOpGreaterThan:
  case EOpLessThanEqual:
  case EOpGreaterThanEqual:
    if ((reduceComparison) && (op - EOpEqual < 2)) {
      pBVar2 = &this->builder;
      ppIVar3 = (this->builder).module.idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppIVar3[left] == (Instruction *)0x0) {
        pIVar11 = *ppIVar3;
      }
      else {
        pIVar11 = ppIVar3[ppIVar3[left]->typeId];
      }
      if (((pIVar11->opCode == OpTypeVector) || (pIVar11->opCode == OpTypeMatrix)) ||
         (bVar6 = spv::Builder::isAggregate(pBVar2,left), bVar6)) {
        IVar8 = spv::Builder::createCompositeCompare
                          (pBVar2,decorations->precision,left,right,op == EOpEqual);
        anon_unknown_0::OpDecorations::addNonUniform(decorations,pBVar2,IVar8);
        return IVar8;
      }
    }
    IVar8 = (*(code *)(&DAT_00737428 + *(int *)(&DAT_00737428 + (ulong)(op - EOpEqual) * 4)))(this);
    return IVar8;
  case EOpComma:
    goto switchD_003c06b9_caseD_2b;
  case EOpVectorTimesScalar:
switchD_003c06b9_caseD_2c:
    pBVar2 = &this->builder;
    ppIVar3 = (this->builder).module.idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar11 = ppIVar3[left];
    if (uVar1 < 3) {
      if (pIVar11 == (Instruction *)0x0) {
        uVar12 = 0;
      }
      else {
        uVar12 = (ulong)pIVar11->typeId;
      }
      pIVar4 = ppIVar3[right];
      if (ppIVar3[uVar12]->opCode != OpTypeVector) {
        if (pIVar4 == (Instruction *)0x0) {
          uVar12 = 0;
        }
        else {
          uVar12 = (ulong)pIVar4->typeId;
        }
        if (ppIVar3[uVar12]->opCode != OpTypeVector) {
          if (pIVar11 == (Instruction *)0x0) {
            uVar12 = 0;
          }
          else {
            uVar12 = (ulong)pIVar11->typeId;
          }
          if (ppIVar3[uVar12]->opCode != OpTypeCooperativeVectorNV) {
            if (pIVar4 == (Instruction *)0x0) {
              uVar12 = 0;
            }
            else {
              uVar12 = (ulong)pIVar4->typeId;
            }
            opCode = OpFMul;
            if (ppIVar3[uVar12]->opCode != OpTypeCooperativeVectorNV) goto LAB_003c08ff;
          }
        }
      }
      if (pIVar4 == (Instruction *)0x0) {
        pIVar11 = *ppIVar3;
      }
      else {
        pIVar11 = ppIVar3[pIVar4->typeId];
      }
      local_84 = left;
      local_80 = right;
      if ((pIVar11->opCode != OpTypeVector) && (pIVar11->opCode != OpTypeCooperativeVectorNV)) {
        local_84 = right;
        local_80 = left;
      }
      left = local_80;
      right = local_84;
      bVar6 = spv::Builder::isScalar(pBVar2,local_84);
      if (!bVar6) {
        __assert_fail("builder.isScalar(right)",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                      ,0x1bba,
                      "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryOperation(glslang::TOperator, OpDecorations &, spv::Id, spv::Id, spv::Id, glslang::TBasicType, bool)"
                     );
      }
      opCode = OpVectorTimesScalar;
      bVar6 = false;
    }
    else {
      if (pIVar11 == (Instruction *)0x0) {
        uVar12 = 0;
      }
      else {
        uVar12 = (ulong)pIVar11->typeId;
      }
      pIVar11 = ppIVar3[right];
      if (ppIVar3[uVar12]->opCode != OpTypeCooperativeVectorNV) {
        if (pIVar11 == (Instruction *)0x0) {
          uVar12 = 0;
        }
        else {
          uVar12 = (ulong)pIVar11->typeId;
        }
        opCode = OpIMul;
        if (ppIVar3[uVar12]->opCode != OpTypeCooperativeVectorNV) goto LAB_003c08ff;
      }
      if (pIVar11 == (Instruction *)0x0) {
        uVar12 = 0;
      }
      else {
        uVar12 = (ulong)pIVar11->typeId;
      }
      IVar8 = right;
      if (ppIVar3[uVar12]->opCode == OpTypeCooperativeVectorNV) {
        IVar8 = left;
        local_80 = right;
      }
      left = local_80;
      bVar6 = spv::Builder::isScalar(pBVar2,IVar8);
      if (!bVar6) {
        __assert_fail("builder.isScalar(right)",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                      ,0x1bc2,
                      "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryOperation(glslang::TOperator, OpDecorations &, spv::Id, spv::Id, spv::Id, glslang::TBasicType, bool)"
                     );
      }
      pIVar11 = (this->builder).module.idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start[left];
      if (pIVar11 == (Instruction *)0x0) {
        IVar13 = 0;
      }
      else {
        IVar13 = pIVar11->typeId;
      }
      local_68._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_68._M_impl.super__Vector_impl_data._M_start._4_4_,IVar8);
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,&local_68);
      right = spv::Builder::createCompositeConstruct
                        (pBVar2,IVar13,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
      local_84 = right;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
      opCode = OpIMul;
      bVar6 = true;
    }
    goto LAB_003c08ff;
  case EOpVectorTimesMatrix:
    break;
  case EOpMatrixTimesVector:
    opCode = OpMatrixTimesVector;
    break;
  case EOpMatrixTimesScalar:
switchD_003c06b9_caseD_2f:
    opCode = OpMatrixTimesScalar;
    break;
  case EOpLogicalOr:
    opCode = OpLogicalOr;
    goto LAB_003c08d9;
  case EOpLogicalXor:
    opCode = OpLogicalNotEqual;
    goto LAB_003c08d9;
  case EOpLogicalAnd:
    opCode = OpLogicalAnd;
LAB_003c08d9:
    bVar6 = false;
    break;
  default:
    switch(op) {
    case EOpAddAssign:
      goto switchD_003c06b9_caseD_19;
    case EOpSubAssign:
      goto switchD_003c06b9_caseD_1a;
    case EOpMulAssign:
      goto switchD_003c06b9_caseD_1b;
    case EOpVectorTimesMatrixAssign:
      break;
    case EOpVectorTimesScalarAssign:
      goto switchD_003c06b9_caseD_2c;
    case EOpMatrixTimesScalarAssign:
      goto switchD_003c06b9_caseD_2f;
    case EOpMatrixTimesMatrixAssign:
switchD_003c070e_caseD_1e6:
      opCode = OpMatrixTimesMatrix;
      break;
    case EOpDivAssign:
      goto switchD_003c06b9_caseD_1c;
    case EOpModAssign:
      goto switchD_003c06b9_caseD_1d;
    case EOpAndAssign:
      goto switchD_003c06b9_caseD_20;
    case EOpInclusiveOrAssign:
      goto switchD_003c06b9_caseD_21;
    case EOpExclusiveOrAssign:
      goto switchD_003c06b9_caseD_22;
    case EOpLeftShiftAssign:
      goto switchD_003c06b9_caseD_1f;
    case EOpRightShiftAssign:
      goto switchD_003c06b9_caseD_1e;
    default:
      switch(op) {
      case EOpAbsDifference:
        opCode = ((uVar9 & 0xfffffff9) == 0) + OpAbsISubINTEL;
        break;
      case EOpAddSaturate:
        opCode = ((uVar9 & 0xfffffff9) == 0) + OpIAddSatINTEL;
        break;
      case EOpSubSaturate:
        opCode = ((uVar9 & 0xfffffff9) == 0) + OpISubSatINTEL;
        break;
      case EOpAverage:
        opCode = ((uVar9 & 0xfffffff9) == 0) + OpIAverageINTEL;
        break;
      case EOpAverageRounded:
        opCode = ((uVar9 & 0xfffffff9) == 0) + OpIAverageRoundedINTEL;
        break;
      case EOpMul32x16:
        opCode = ((uVar9 & 0xfffffff9) == 0) + OpIMul32x16INTEL;
        break;
      default:
        if (op == EOpMatrixTimesMatrix) goto switchD_003c070e_caseD_1e6;
        if (op == EOpOuterProduct) {
          opCode = OpOuterProduct;
          goto LAB_003c08d9;
        }
        if (op != EOpExpectEXT) {
          return 0;
        }
        opCode = OpExpectKHR;
      }
    }
  }
LAB_003c08ff:
  ppIVar3 = (this->builder).module.idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppIVar3[left] == (Instruction *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = (ulong)ppIVar3[left]->typeId;
  }
  pBVar2 = &this->builder;
  if (ppIVar3[uVar12]->opCode != OpTypeMatrix) {
    if (ppIVar3[right] == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)ppIVar3[right]->typeId;
    }
    if (((ppIVar3[uVar12]->opCode != OpTypeMatrix) &&
        (bVar5 = spv::Builder::isCooperativeMatrix(pBVar2,left), !bVar5)) &&
       (bVar5 = spv::Builder::isCooperativeMatrix(pBVar2,right), !bVar5)) {
      if (bVar6) {
        spv::Builder::promoteScalar(pBVar2,decorations->precision,&local_80,&local_84);
        left = local_80;
        right = local_84;
      }
      goto LAB_003c0bf8;
    }
  }
  bVar14 = 0;
  switch(opCode) {
  case OpFDiv:
    ppIVar3 = (this->builder).module.idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar11 = ppIVar3[left];
    if (pIVar11 == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)pIVar11->typeId;
    }
    opCode = OpFDiv;
    if (ppIVar3[uVar12]->opCode == OpTypeMatrix) {
      bVar6 = spv::Builder::isScalar(pBVar2,right);
      IVar8 = 0;
      bVar14 = 0;
      if (bVar6) {
        pIVar11 = (this->builder).module.idToInstruction.
                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[right];
        if (pIVar11 != (Instruction *)0x0) {
          IVar8 = pIVar11->typeId;
        }
        IVar13 = spv::Builder::makeFpConstant(pBVar2,IVar8,1.0,false);
        right = spv::Builder::createBinOp(pBVar2,OpFDiv,IVar8,IVar13,right);
        opCode = OpMatrixTimesScalar;
        goto LAB_003c0ba8;
      }
    }
    else {
      bVar14 = 0;
    }
    break;
  case OpMatrixTimesScalar:
    ppIVar3 = (this->builder).module.idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar11 = ppIVar3[right];
    if (pIVar11 == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)pIVar11->typeId;
    }
    uVar9 = left;
    uVar1 = right;
    if ((ppIVar3[uVar12]->opCode != OpTypeMatrix) &&
       (bVar6 = spv::Builder::isCooperativeMatrix(pBVar2,right), uVar9 = left, uVar1 = right, !bVar6
       )) {
      uVar9 = right;
      uVar1 = left;
    }
    left = uVar1;
    right = uVar9;
    bVar6 = spv::Builder::isScalar(pBVar2,right);
    if (!bVar6) {
      __assert_fail("builder.isScalar(right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cbd,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    opCode = OpMatrixTimesScalar;
    bVar14 = 1;
    break;
  case OpVectorTimesMatrix:
    ppIVar3 = (this->builder).module.idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppIVar3[left] == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)ppIVar3[left]->typeId;
    }
    if (ppIVar3[uVar12]->opCode != OpTypeVector) {
      __assert_fail("builder.isVector(left)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc0,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    if (ppIVar3[right] == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)ppIVar3[right]->typeId;
    }
    if (ppIVar3[uVar12]->opCode != OpTypeMatrix) {
      __assert_fail("builder.isMatrix(right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc1,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    opCode = OpVectorTimesMatrix;
    goto LAB_003c0ba8;
  case OpMatrixTimesVector:
    ppIVar3 = (this->builder).module.idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppIVar3[left] == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)ppIVar3[left]->typeId;
    }
    if (ppIVar3[uVar12]->opCode != OpTypeMatrix) {
      __assert_fail("builder.isMatrix(left)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc4,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    if (ppIVar3[right] == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)ppIVar3[right]->typeId;
    }
    if (ppIVar3[uVar12]->opCode != OpTypeVector) {
      __assert_fail("builder.isVector(right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc5,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    opCode = OpMatrixTimesVector;
    goto LAB_003c0ba8;
  case OpMatrixTimesMatrix:
    ppIVar3 = (this->builder).module.idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppIVar3[left] == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)ppIVar3[left]->typeId;
    }
    if (ppIVar3[uVar12]->opCode != OpTypeMatrix) {
      __assert_fail("builder.isMatrix(left)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc8,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    if (ppIVar3[right] == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)ppIVar3[right]->typeId;
    }
    if (ppIVar3[uVar12]->opCode != OpTypeMatrix) {
      __assert_fail("builder.isMatrix(right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc9,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    opCode = OpMatrixTimesMatrix;
LAB_003c0ba8:
    bVar14 = 1;
  }
  bVar6 = spv::Builder::isCooperativeMatrix(pBVar2,left);
  if ((bVar6) || (bVar6 = spv::Builder::isCooperativeMatrix(pBVar2,right), (bVar14 | bVar6) == 1)) {
LAB_003c0bf8:
    IVar8 = spv::Builder::createBinOp(pBVar2,opCode,typeId,left,right);
    anon_unknown_0::OpDecorations::addNoContraction(decorations,pBVar2,IVar8);
    anon_unknown_0::OpDecorations::addNonUniform(decorations,pBVar2,IVar8);
    IVar8 = spv::Builder::setPrecision(pBVar2,IVar8,decorations->precision);
    return IVar8;
  }
  if ((0xc < opCode - OpFAdd) || ((0x1095U >> (opCode - OpFAdd & 0x1f) & 1) == 0)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x1d08,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                 );
  }
  ppIVar3 = (this->builder).module.idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppIVar3[left] == (Instruction *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = (ulong)ppIVar3[left]->typeId;
  }
  OVar7 = ppIVar3[uVar12]->opCode;
  if (ppIVar3[right] == (Instruction *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = (ulong)ppIVar3[right]->typeId;
  }
  local_74 = ppIVar3[uVar12]->opCode;
  uVar9 = right;
  if (OVar7 == OpTypeMatrix) {
    uVar9 = left;
  }
  local_70 = spv::Builder::getNumColumns(pBVar2,uVar9);
  uVar9 = spv::Builder::getNumRows(pBVar2,uVar9);
  IVar8 = spv::Builder::getScalarTypeId(pBVar2,typeId);
  IVar8 = spv::Builder::makeVectorType(pBVar2,IVar8,uVar9);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar6 = spv::Builder::isScalar(pBVar2,left);
  local_78 = left;
  if (bVar6) {
LAB_003c0d24:
    IVar13 = spv::Builder::smearScalar(pBVar2,decorations->precision,left,IVar8);
  }
  else {
    bVar6 = spv::Builder::isScalar(pBVar2,right);
    IVar13 = 0;
    left = right;
    if (bVar6) goto LAB_003c0d24;
  }
  for (local_7c = 0; local_7c < local_70; local_7c = local_7c + 1) {
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,&local_7c);
    IVar10 = IVar13;
    if (OVar7 == OpTypeMatrix) {
      IVar10 = spv::Builder::createCompositeExtract
                         (pBVar2,local_78,IVar8,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68);
    }
    right_00 = IVar13;
    if (local_74 == OpTypeMatrix) {
      right_00 = spv::Builder::createCompositeExtract
                           (pBVar2,right,IVar8,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68);
    }
    IVar10 = spv::Builder::createBinOp(pBVar2,opCode,IVar8,IVar10,right_00);
    anon_unknown_0::OpDecorations::addNoContraction(decorations,pBVar2,IVar10);
    anon_unknown_0::OpDecorations::addNonUniform(decorations,pBVar2,IVar10);
    local_6c = spv::Builder::setPrecision(pBVar2,IVar10,decorations->precision);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_6c);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
  }
  IVar8 = spv::Builder::createCompositeConstruct
                    (pBVar2,typeId,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48)
  ;
  IVar8 = spv::Builder::setPrecision(pBVar2,IVar8,decorations->precision);
  anon_unknown_0::OpDecorations::addNonUniform(decorations,pBVar2,IVar8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
switchD_003c06b9_caseD_2b:
  return IVar8;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createBinaryOperation(glslang::TOperator op, OpDecorations& decorations,
                                                      spv::Id typeId, spv::Id left, spv::Id right,
                                                      glslang::TBasicType typeProxy, bool reduceComparison)
{
    bool isUnsigned = isTypeUnsignedInt(typeProxy);
    bool isFloat = isTypeFloat(typeProxy);
    bool isBool = typeProxy == glslang::EbtBool;

    spv::Op binOp = spv::OpNop;
    bool needMatchingVectors = true;  // for non-matrix ops, would a scalar need to smear to match a vector?
    bool comparison = false;

    switch (op) {
    case glslang::EOpAdd:
    case glslang::EOpAddAssign:
        if (isFloat)
            binOp = spv::OpFAdd;
        else
            binOp = spv::OpIAdd;
        break;
    case glslang::EOpSub:
    case glslang::EOpSubAssign:
        if (isFloat)
            binOp = spv::OpFSub;
        else
            binOp = spv::OpISub;
        break;
    case glslang::EOpMul:
    case glslang::EOpMulAssign:
        if (isFloat)
            binOp = spv::OpFMul;
        else
            binOp = spv::OpIMul;
        break;
    case glslang::EOpVectorTimesScalar:
    case glslang::EOpVectorTimesScalarAssign:
        if (isFloat && (builder.isVector(left) || builder.isVector(right) || builder.isCooperativeVector(left) || builder.isCooperativeVector(right))) {
            if (builder.isVector(right) || builder.isCooperativeVector(right))
                std::swap(left, right);
            assert(builder.isScalar(right));
            needMatchingVectors = false;
            binOp = spv::OpVectorTimesScalar;
        } else if (isFloat) {
            binOp = spv::OpFMul;
        } else if (builder.isCooperativeVector(left) || builder.isCooperativeVector(right)) {
            if (builder.isCooperativeVector(right))
                std::swap(left, right);
            assert(builder.isScalar(right));
            // Construct a cooperative vector from the scalar
            right = builder.createCompositeConstruct(builder.getTypeId(left), { right });
            binOp = spv::OpIMul;
        } else {
            binOp = spv::OpIMul;
        }
        break;
    case glslang::EOpVectorTimesMatrix:
    case glslang::EOpVectorTimesMatrixAssign:
        binOp = spv::OpVectorTimesMatrix;
        break;
    case glslang::EOpMatrixTimesVector:
        binOp = spv::OpMatrixTimesVector;
        break;
    case glslang::EOpMatrixTimesScalar:
    case glslang::EOpMatrixTimesScalarAssign:
        binOp = spv::OpMatrixTimesScalar;
        break;
    case glslang::EOpMatrixTimesMatrix:
    case glslang::EOpMatrixTimesMatrixAssign:
        binOp = spv::OpMatrixTimesMatrix;
        break;
    case glslang::EOpOuterProduct:
        binOp = spv::OpOuterProduct;
        needMatchingVectors = false;
        break;

    case glslang::EOpDiv:
    case glslang::EOpDivAssign:
        if (isFloat)
            binOp = spv::OpFDiv;
        else if (isUnsigned)
            binOp = spv::OpUDiv;
        else
            binOp = spv::OpSDiv;
        break;
    case glslang::EOpMod:
    case glslang::EOpModAssign:
        if (isFloat)
            binOp = spv::OpFMod;
        else if (isUnsigned)
            binOp = spv::OpUMod;
        else
            binOp = spv::OpSMod;
        break;
    case glslang::EOpRightShift:
    case glslang::EOpRightShiftAssign:
        if (isUnsigned)
            binOp = spv::OpShiftRightLogical;
        else
            binOp = spv::OpShiftRightArithmetic;
        break;
    case glslang::EOpLeftShift:
    case glslang::EOpLeftShiftAssign:
        binOp = spv::OpShiftLeftLogical;
        break;
    case glslang::EOpAnd:
    case glslang::EOpAndAssign:
        binOp = spv::OpBitwiseAnd;
        break;
    case glslang::EOpLogicalAnd:
        needMatchingVectors = false;
        binOp = spv::OpLogicalAnd;
        break;
    case glslang::EOpInclusiveOr:
    case glslang::EOpInclusiveOrAssign:
        binOp = spv::OpBitwiseOr;
        break;
    case glslang::EOpLogicalOr:
        needMatchingVectors = false;
        binOp = spv::OpLogicalOr;
        break;
    case glslang::EOpExclusiveOr:
    case glslang::EOpExclusiveOrAssign:
        binOp = spv::OpBitwiseXor;
        break;
    case glslang::EOpLogicalXor:
        needMatchingVectors = false;
        binOp = spv::OpLogicalNotEqual;
        break;

    case glslang::EOpAbsDifference:
        binOp = isUnsigned ? spv::OpAbsUSubINTEL : spv::OpAbsISubINTEL;
        break;

    case glslang::EOpAddSaturate:
        binOp = isUnsigned ? spv::OpUAddSatINTEL : spv::OpIAddSatINTEL;
        break;

    case glslang::EOpSubSaturate:
        binOp = isUnsigned ? spv::OpUSubSatINTEL : spv::OpISubSatINTEL;
        break;

    case glslang::EOpAverage:
        binOp = isUnsigned ? spv::OpUAverageINTEL : spv::OpIAverageINTEL;
        break;

    case glslang::EOpAverageRounded:
        binOp = isUnsigned ? spv::OpUAverageRoundedINTEL : spv::OpIAverageRoundedINTEL;
        break;

    case glslang::EOpMul32x16:
        binOp = isUnsigned ? spv::OpUMul32x16INTEL : spv::OpIMul32x16INTEL;
        break;

    case glslang::EOpExpectEXT:
        binOp = spv::OpExpectKHR;
        break;

    case glslang::EOpLessThan:
    case glslang::EOpGreaterThan:
    case glslang::EOpLessThanEqual:
    case glslang::EOpGreaterThanEqual:
    case glslang::EOpEqual:
    case glslang::EOpNotEqual:
    case glslang::EOpVectorEqual:
    case glslang::EOpVectorNotEqual:
        comparison = true;
        break;
    default:
        break;
    }

    // handle mapped binary operations (should be non-comparison)
    if (binOp != spv::OpNop) {
        assert(comparison == false);
        if (builder.isMatrix(left) || builder.isMatrix(right) ||
            builder.isCooperativeMatrix(left) || builder.isCooperativeMatrix(right))
            return createBinaryMatrixOperation(binOp, decorations, typeId, left, right);

        // No matrix involved; make both operands be the same number of components, if needed
        if (needMatchingVectors)
            builder.promoteScalar(decorations.precision, left, right);

        spv::Id result = builder.createBinOp(binOp, typeId, left, right);
        decorations.addNoContraction(builder, result);
        decorations.addNonUniform(builder, result);
        return builder.setPrecision(result, decorations.precision);
    }

    if (! comparison)
        return 0;

    // Handle comparison instructions

    if (reduceComparison && (op == glslang::EOpEqual || op == glslang::EOpNotEqual)
                         && (builder.isVector(left) || builder.isMatrix(left) || builder.isAggregate(left))) {
        spv::Id result = builder.createCompositeCompare(decorations.precision, left, right, op == glslang::EOpEqual);
        decorations.addNonUniform(builder, result);
        return result;
    }

    switch (op) {
    case glslang::EOpLessThan:
        if (isFloat)
            binOp = spv::OpFOrdLessThan;
        else if (isUnsigned)
            binOp = spv::OpULessThan;
        else
            binOp = spv::OpSLessThan;
        break;
    case glslang::EOpGreaterThan:
        if (isFloat)
            binOp = spv::OpFOrdGreaterThan;
        else if (isUnsigned)
            binOp = spv::OpUGreaterThan;
        else
            binOp = spv::OpSGreaterThan;
        break;
    case glslang::EOpLessThanEqual:
        if (isFloat)
            binOp = spv::OpFOrdLessThanEqual;
        else if (isUnsigned)
            binOp = spv::OpULessThanEqual;
        else
            binOp = spv::OpSLessThanEqual;
        break;
    case glslang::EOpGreaterThanEqual:
        if (isFloat)
            binOp = spv::OpFOrdGreaterThanEqual;
        else if (isUnsigned)
            binOp = spv::OpUGreaterThanEqual;
        else
            binOp = spv::OpSGreaterThanEqual;
        break;
    case glslang::EOpEqual:
    case glslang::EOpVectorEqual:
        if (isFloat)
            binOp = spv::OpFOrdEqual;
        else if (isBool)
            binOp = spv::OpLogicalEqual;
        else
            binOp = spv::OpIEqual;
        break;
    case glslang::EOpNotEqual:
    case glslang::EOpVectorNotEqual:
        if (isFloat)
            binOp = spv::OpFUnordNotEqual;
        else if (isBool)
            binOp = spv::OpLogicalNotEqual;
        else
            binOp = spv::OpINotEqual;
        break;
    default:
        break;
    }

    if (binOp != spv::OpNop) {
        spv::Id result = builder.createBinOp(binOp, typeId, left, right);
        decorations.addNoContraction(builder, result);
        decorations.addNonUniform(builder, result);
        return builder.setPrecision(result, decorations.precision);
    }

    return 0;
}